

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.cpp
# Opt level: O2

bool __thiscall CaseInsensitiveLess::operator()(CaseInsensitiveLess *this,string *s1,string *s2)

{
  pointer pcVar1;
  bool bVar2;
  
  pcVar1 = (s1->_M_dataplus)._M_p;
  std::operator()(pcVar1,pcVar1 + s1->_M_string_length);
  pcVar1 = (s2->_M_dataplus)._M_p;
  std::operator()(pcVar1,pcVar1 + s2->_M_string_length);
  bVar2 = std::operator<(s1,s2);
  return bVar2;
}

Assistant:

bool operator() (std::string s1, std::string s2) const {
        std::for_each(std::begin(s1), std::end(s1), [](char& c){
            c = std::tolower(c);
        });
        std::for_each(std::begin(s2), std::end(s2), [](char& c){
            c = std::tolower(c);
        });
        return s1 < s2;
    }